

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::MarkDestinationsDirty
          (CWallet *this,
          set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          *destinations)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  bool bVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  long in_FS_OFFSET;
  CTxDestination dst;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = (this->mapWallet)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      if ((*(char *)&p_Var7[0x36]._M_nxt == '\0') &&
         (p_Var1 = p_Var7[0x38]._M_nxt, p_Var1[4]._M_nxt != p_Var1[3]._M_nxt)) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          local_88._16_8_ = 0;
          local_88._24_8_ = 0;
          local_88._0_8_ = 0;
          local_88._8_8_ = 0;
          local_40 = 0;
          bVar3 = ExtractDestination((CScript *)(p_Var1[3]._M_nxt + uVar5 * 5 + 1),
                                     (CTxDestination *)&local_88._M_first);
          if ((bVar3) &&
             (cVar4 = std::
                      _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                      ::find(&destinations->_M_t,(key_type *)&local_88._M_first),
             (_Rb_tree_header *)cVar4._M_node != &(destinations->_M_t)._M_impl.super__Rb_tree_header
             )) {
            p_Var7[0x12]._M_nxt = (_Hash_node_base *)0x0;
            p_Var7[0x1b]._M_nxt = (_Hash_node_base *)0x0;
            p_Var7[0x24]._M_nxt = (_Hash_node_base *)0x0;
            p_Var7[0x2d]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined2 *)&p_Var7[0x36]._M_nxt = 1;
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_88._M_first);
            break;
          }
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_88._M_first);
          p_Var1 = p_Var7[0x38]._M_nxt;
          uVar5 = ((long)p_Var1[4]._M_nxt - (long)p_Var1[3]._M_nxt >> 3) * -0x3333333333333333;
          bVar3 = uVar6 <= uVar5;
          lVar2 = uVar5 - uVar6;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3 && lVar2 != 0);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::MarkDestinationsDirty(const std::set<CTxDestination>& destinations) {
    for (auto& entry : mapWallet) {
        CWalletTx& wtx = entry.second;
        if (wtx.m_is_cache_empty) continue;
        for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
            CTxDestination dst;
            if (ExtractDestination(wtx.tx->vout[i].scriptPubKey, dst) && destinations.count(dst)) {
                wtx.MarkDirty();
                break;
            }
        }
    }
}